

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTools.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
Assimp::trim_whitespaces<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  while (sVar6 = str->_M_string_length, sVar6 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    cVar2 = *pcVar3;
    if ((cVar2 != '\t') && (cVar2 != ' ')) goto LAB_00464e02;
    str->_M_string_length = 0;
    *pcVar3 = '\0';
  }
  goto LAB_00464e28;
  while( true ) {
    str->_M_string_length = sVar6 - 1;
    pcVar4[sVar6 - 1] = '\0';
    sVar6 = str->_M_string_length;
    if (sVar6 == 0) break;
LAB_00464e02:
    pcVar4 = (str->_M_dataplus)._M_p;
    cVar2 = pcVar4[sVar6 - 1];
    if ((cVar2 != ' ') && (cVar2 != '\t')) goto LAB_00464e2a;
  }
LAB_00464e28:
  sVar6 = 0;
LAB_00464e2a:
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar4 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&str->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar5;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar4;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = sVar6;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

string_type trim_whitespaces(string_type str)
{
    while (!str.empty() && IsSpace(str[0])) str.erase(0);
    while (!str.empty() && IsSpace(str[str.length() - 1])) str.erase(str.length() - 1);
    return str;
}